

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O0

void __thiscall
TPZMHMeshControl::DefinePartition(TPZMHMeshControl *this,TPZVec<long> *partitionindex)

{
  bool bVar1;
  int iVar2;
  TPZGeoEl *pTVar3;
  long *plVar4;
  mapped_type *this_00;
  TPZVec<long> *in_RSI;
  long in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>,_bool> pVar5;
  int64_t bc_index;
  pair<long,_long> adjacentGroupIndexes;
  TPZGeoElBC bc;
  int64_t neighGroup;
  int64_t thisGroup;
  anon_class_24_3_e57ff38d hasSkeletonNeighbour;
  int64_t neighId;
  int64_t thisId;
  TPZGeoElSide neighbour_1;
  TPZGeoElSide gelside_1;
  int iside;
  int nsides;
  pair<long,_long> val;
  int64_t neighindex;
  int partition;
  TPZGeoElSide neighbour;
  TPZGeoElSide gelside;
  TPZGeoEl *gel;
  int64_t iel;
  int64_t nel;
  int dim;
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  skeleton;
  TPZGeoMesh *gmesh;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  _Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> in_stack_fffffffffffffd60;
  TPZGeoEl *in_stack_fffffffffffffd68;
  TPZGeoEl *in_stack_fffffffffffffd70;
  TPZGeoElSide *in_stack_fffffffffffffd78;
  TPZGeoEl *in_stack_fffffffffffffd80;
  anon_class_24_3_e57ff38d *in_stack_fffffffffffffd98;
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  *in_stack_fffffffffffffda0;
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  *in_stack_fffffffffffffe00;
  TPZVec<long> *in_stack_fffffffffffffe08;
  TPZMHMeshControl *in_stack_fffffffffffffe10;
  TPZGeoEl *local_190;
  pair<const_long,_std::pair<long,_long>_> local_188;
  TPZGeoElSide *local_170;
  pair<long,_long> local_168;
  TPZGeoElBC local_158;
  TPZGeoElSide *local_150;
  TPZGeoElSide *local_148;
  TPZGeoElSide *local_140;
  undefined1 *local_138;
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  *local_128;
  int64_t local_120;
  TPZGeoElSide local_118;
  undefined4 local_fc;
  undefined1 local_f8 [24];
  int local_e0;
  int local_dc;
  int64_t local_d8;
  int64_t local_d0;
  pair<long,_long> local_c8;
  int64_t local_b8;
  int local_ac;
  TPZGeoElSide local_a8 [2];
  TPZGeoEl *local_78;
  long local_70;
  long local_68;
  int local_4c;
  TPZGeoMesh *local_18;
  TPZVec<long> *local_10;
  
  local_10 = in_RSI;
  local_18 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  std::
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  ::map((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
         *)0x1e07c85);
  local_4c = TPZGeoMesh::Dimension(local_18);
  local_68 = TPZGeoMesh::NElements((TPZGeoMesh *)0x1e07cb6);
  for (local_70 = 0; local_70 < local_68; local_70 = local_70 + 1) {
    local_78 = TPZGeoMesh::Element((TPZGeoMesh *)in_stack_fffffffffffffd60._M_node,
                                   CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    iVar2 = (**(code **)(*(long *)local_78 + 0x1d0))();
    if (iVar2 == 0) {
      iVar2 = (**(code **)(*(long *)local_78 + 0x210))();
      if (iVar2 == local_4c + -1) {
        (**(code **)(*(long *)local_78 + 0xf0))();
        TPZGeoElSide::TPZGeoElSide
                  ((TPZGeoElSide *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                   (int)((ulong)in_stack_fffffffffffffd60._M_node >> 0x20));
        TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffd68);
        pTVar3 = TPZGeoElSide::Element(local_a8);
        iVar2 = (**(code **)(*(long *)pTVar3 + 0x210))();
        if (iVar2 != local_4c) {
          pzinternal::DebugStopImpl((char *)neighId,(size_t)hasSkeletonNeighbour.this);
        }
        in_stack_fffffffffffffe08 = local_10;
        in_stack_fffffffffffffe10 = (TPZMHMeshControl *)TPZGeoElSide::Element(local_a8);
        in_stack_fffffffffffffe00 =
             (map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
              *)TPZGeoEl::Index((TPZGeoEl *)in_stack_fffffffffffffe10);
        plVar4 = TPZVec<long>::operator[]
                           (in_stack_fffffffffffffe08,(int64_t)in_stack_fffffffffffffe00);
        local_ac = (int)*plVar4;
        pTVar3 = TPZGeoElSide::Element(local_a8);
        local_b8 = TPZGeoEl::Index(pTVar3);
        local_d0 = TPZGeoEl::Index(local_78);
        std::pair<long,_long>::pair<int_&,_long,_true>(&local_c8,&local_ac,&local_d0);
        local_d8 = TPZGeoEl::Index(local_78);
        this_00 = std::
                  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                  ::operator[](in_stack_fffffffffffffda0,
                               (key_type_conflict1 *)in_stack_fffffffffffffd98);
        std::pair<long,_long>::operator=(this_00,&local_c8);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e07fe8);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e07ff5);
      }
      else {
        local_dc = (**(code **)(*(long *)local_78 + 0xf0))();
        for (local_e0 = 0; local_e0 < local_dc; local_e0 = local_e0 + 1) {
          TPZGeoElSide::TPZGeoElSide
                    ((TPZGeoElSide *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                     (int)((ulong)in_stack_fffffffffffffd60._M_node >> 0x20));
          iVar2 = TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_fffffffffffffd60._M_node);
          if (iVar2 == local_4c + -1) {
            TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffd68);
            pTVar3 = TPZGeoElSide::Element(&local_118);
            iVar2 = (**(code **)(*(long *)pTVar3 + 0x210))();
            if (iVar2 == local_4c) {
              local_120 = TPZGeoEl::Index(local_78);
              pTVar3 = TPZGeoElSide::Element(&local_118);
              in_stack_fffffffffffffda0 =
                   (map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                    *)TPZGeoEl::Index(pTVar3);
              local_140 = &local_118;
              local_138 = local_f8;
              local_128 = in_stack_fffffffffffffda0;
              in_stack_fffffffffffffd98 =
                   (anon_class_24_3_e57ff38d *)TPZVec<long>::operator[](local_10,local_120);
              local_148 = in_stack_fffffffffffffd98->neighbour;
              plVar4 = TPZVec<long>::operator[](local_10,(int64_t)local_128);
              local_150 = (TPZGeoElSide *)*plVar4;
              if ((local_148 != local_150) &&
                 (bVar1 = DefinePartition::anon_class_24_3_e57ff38d::operator()
                                    (in_stack_fffffffffffffd98), !bVar1)) {
                TPZGeoElBC::TPZGeoElBC
                          ((TPZGeoElBC *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                           (int)((ulong)in_stack_fffffffffffffd70 >> 0x20));
                std::pair<long,_long>::pair<long_&,_long_&,_true>
                          (&local_168,(long *)&local_148,(long *)&local_150);
                in_stack_fffffffffffffd80 = TPZGeoElBC::CreatedElement(&local_158);
                in_stack_fffffffffffffd78 =
                     (TPZGeoElSide *)TPZGeoEl::Index(in_stack_fffffffffffffd80);
                local_170 = in_stack_fffffffffffffd78;
                if (in_stack_fffffffffffffd78 == local_150) {
                  pzinternal::DebugStopImpl((char *)neighId,(size_t)hasSkeletonNeighbour.this);
                }
                in_stack_fffffffffffffd70 = TPZGeoElBC::CreatedElement(&local_158);
                in_stack_fffffffffffffd68 = (TPZGeoEl *)TPZGeoEl::Index(in_stack_fffffffffffffd70);
                local_190 = in_stack_fffffffffffffd68;
                std::pair<const_long,_std::pair<long,_long>_>::
                pair<long,_std::pair<long,_long>_&,_true>(&local_188,(long *)&local_190,&local_168);
                pVar5 = std::
                        map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                        ::insert((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                                  *)in_stack_fffffffffffffd70,
                                 (value_type *)in_stack_fffffffffffffd68);
                in_stack_fffffffffffffd60 = pVar5.first._M_node;
                in_stack_fffffffffffffd5f = pVar5.second;
              }
              local_fc = 0;
            }
            else {
              local_fc = 7;
            }
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e08390);
          }
          else {
            local_fc = 7;
          }
          TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e0839d);
        }
      }
    }
  }
  DefinePartition(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  ::~map((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
          *)0x1e0841a);
  return;
}

Assistant:

void TPZMHMeshControl::DefinePartition(TPZVec<int64_t> &partitionindex) {

    TPZGeoMesh *gmesh = this->fGMesh.operator->();

    // Creates skeleton elements
    std::map<int64_t, std::pair<int64_t, int64_t>> skeleton;

    int dim = gmesh->Dimension();

    const int64_t nel = gmesh->NElements();
    for (int64_t iel = 0; iel < nel; iel++) {

        TPZGeoEl *gel = gmesh->Element(iel);

        if (gel->HasSubElement()) continue;
        if (gel->Dimension() == dim-1)
        {
            TPZGeoElSide gelside(gel,gel->NSides()-1);
            TPZGeoElSide neighbour = gelside.Neighbour();
            if(neighbour.Element()->Dimension() != dim) DebugStop();
            int partition = partitionindex[neighbour.Element()->Index()];
            int64_t neighindex = neighbour.Element()->Index();
            auto val = std::pair<int64_t,int64_t>(partition,gel->Index());
            skeleton[gel->Index()] = val;
            continue;
        }

        // Iterates through the sides of the element
        int nsides = gel->NSides();

        for (int iside = 0; iside < nsides; iside++) {

            TPZGeoElSide gelside(gel, iside);

            // Filters boundary sides
            if (gelside.Dimension() != dim - 1) continue;

            TPZGeoElSide neighbour = gelside.Neighbour();

            // Filters neighbour sides that belong to volume elements
            if (neighbour.Element()->Dimension() != dim) continue;

            int64_t thisId = gel->Index();
            int64_t neighId = neighbour.Element()->Index();

            // This lambda checks if a skeleton has already been created over gelside
            auto hasSkeletonNeighbour = [&]() -> bool {
                neighbour = gelside.Neighbour();
                while (neighbour != gelside) {
                    int neighbourMatId = neighbour.Element()->MaterialId();
                    if (neighbourMatId == fSkeletonMatId) {
                        return true;
                    }
                   neighbour = neighbour.Neighbour();
                }
                return false;
            };

            int64_t thisGroup = partitionindex[thisId];
            int64_t neighGroup = partitionindex[neighId];

            if (thisGroup != neighGroup) {
                if (!hasSkeletonNeighbour()) {
                    TPZGeoElBC bc(gelside, fSkeletonMatId);
                    std::pair<int64_t, int64_t> adjacentGroupIndexes(thisGroup, neighGroup);
                    int64_t bc_index = bc.CreatedElement()->Index();
                    if(bc_index == neighGroup)
                    {
                        // you are unwillingly creating a boundary skeleton
                        DebugStop();
                    }
                    skeleton.insert({bc.CreatedElement()->Index(), adjacentGroupIndexes});
                }
            }
        }
    }

    DefinePartition(partitionindex, skeleton);
}